

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

bool __thiscall
OpenMesh::PolyConnectivity::is_boundary(PolyConnectivity *this,FaceHandle _fh,bool _check_vertex)

{
  bool bVar1;
  value_type _vh;
  undefined1 local_58 [8];
  ConstFaceVertexIter cfvit;
  undefined1 local_38 [8];
  ConstFaceEdgeIter cfeit;
  bool _check_vertex_local;
  PolyConnectivity *this_local;
  FaceHandle _fh_local;
  
  cfvit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = _fh.super_BaseHandle.idx_;
  cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._23_1_ = _check_vertex;
  cfe_iter((ConstFaceEdgeIter *)local_38,this,_fh);
  while (bVar1 = Iterators::
                 GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                 ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                             *)local_38), bVar1) {
    cfvit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ =
         (int)Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                           *)local_38);
    bVar1 = is_boundary(this,(EdgeHandle)
                             cfvit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.
                             lap_counter_);
    if (bVar1) {
      return true;
    }
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
    ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                  *)local_38);
  }
  if ((cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._23_1_ & 1) != 0) {
    cfv_iter((ConstFaceVertexIter *)local_58,this,_fh);
    while (bVar1 = Iterators::
                   GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                   ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                               *)local_58), bVar1) {
      _vh = Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
            ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                         *)local_58);
      bVar1 = is_boundary(this,(VertexHandle)_vh.super_BaseHandle.idx_);
      if (bVar1) {
        return true;
      }
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    *)local_58);
    }
  }
  return false;
}

Assistant:

bool PolyConnectivity::is_boundary(FaceHandle _fh, bool _check_vertex) const
{
  for (ConstFaceEdgeIter cfeit = cfe_iter( _fh ); cfeit.is_valid(); ++cfeit)
      if (is_boundary( *cfeit ) )
        return true;

  if (_check_vertex)
  {
      for (ConstFaceVertexIter cfvit = cfv_iter( _fh ); cfvit.is_valid(); ++cfvit)
        if (is_boundary( *cfvit ) )
            return true;
  }
  return false;
}